

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdShift<unsigned_long,unsigned_long>
          (Thread *this,BinopFunc<unsigned_long,_unsigned_long> *f)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  ulong uVar3;
  Value VVar4;
  Value VVar5;
  
  VVar4 = Pop(this);
  VVar5 = Pop(this);
  uVar3 = VVar4.field_0.i64_ & 0xffffffff;
  uVar1 = (*f)(VVar5.field_0.i64_,uVar3);
  uVar2 = (*f)(VVar5.field_0._8_8_,uVar3);
  VVar4.field_0._8_8_ = uVar2;
  VVar4.field_0.i64_ = uVar1;
  Push(this,VVar4);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShift(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto amount = Pop<u32>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], amount);
  }
  Push(result);
  return RunResult::Ok;
}